

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O2

type dukglue::detail::MethodInfo<false,_Circle,_int>::MethodRuntime::actually_call<int>
               (duk_context *ctx,MethodType method,Circle *obj,tuple<> *args)

{
  duk_int_t val;
  
  if ((method & 1) != 0) {
    method = *(undefined8 *)(*(long *)(args + (long)&obj->super_Shape) + -1 + method);
  }
  val = (*(code *)method)(args + (long)&obj->super_Shape);
  duk_push_int(ctx,val);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, MethodType method, Cls* obj, const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_method<Cls, RetType, Ts...>(method, obj, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}